

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::clear
          (Image<float,_gimage::PixelTraits<float>_> *this)

{
  void *__s;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_RDI;
  work_t_conflict v;
  store_t_conflict1 sVar2;
  long i;
  long pn;
  store_t_conflict1 inv;
  undefined8 local_20;
  
  v = PixelTraits<float>::invalid();
  sVar2 = PixelTraits<float>::limit(v);
  if ((sVar2 != 0.0) || (NAN(sVar2))) {
    iVar1 = std::abs((int)*(undefined8 *)(in_RDI + 0x18));
    for (local_20 = 0; local_20 < CONCAT44(extraout_var_00,iVar1); local_20 = local_20 + 1) {
      *(store_t_conflict1 *)(*(long *)(in_RDI + 0x20) + local_20 * 4) = sVar2;
    }
  }
  else {
    __s = *(void **)(in_RDI + 0x20);
    iVar1 = std::abs((int)*(undefined8 *)(in_RDI + 0x18));
    memset(__s,0,CONCAT44(extraout_var,iVar1) << 2);
  }
  return;
}

Assistant:

void clear()
    {
      store_t inv=ptraits::limit(ptraits::invalid());

      if (inv == 0)
      {
        memset(pixel, 0, std::abs(n)*sizeof(T));
      }
      else
      {
        long pn=std::abs(n);
        for (long i=0; i<pn; i++)
        {
          pixel[i]=inv;
        }
      }
    }